

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  long lVar1;
  
  memset(this->KeysDown,0,0x285);
  for (lVar1 = 0xe00; lVar1 != 0x3650; lVar1 = lVar1 + 0x10) {
    *(undefined1 *)((long)this + lVar1 + -4) = 0;
    *(undefined8 *)((long)&this->ConfigFlags + lVar1) = 0xbf800000bf800000;
  }
  this->KeyMods = 0;
  this->KeyCtrl = false;
  this->KeyShift = false;
  this->KeyAlt = false;
  this->KeySuper = false;
  for (lVar1 = -0x50; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->NavInputsDownDurationPrev + lVar1 + 0x50) = 0xbf800000;
    *(undefined4 *)((long)this->NavInputsDownDurationPrev + lVar1) = 0xbf800000;
  }
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    memset(KeysDown, 0, sizeof(KeysDown));
#endif
    for (int n = 0; n < IM_ARRAYSIZE(KeysData); n++)
    {
        KeysData[n].Down             = false;
        KeysData[n].DownDuration     = -1.0f;
        KeysData[n].DownDurationPrev = -1.0f;
    }
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = ImGuiKeyModFlags_None;
    for (int n = 0; n < IM_ARRAYSIZE(NavInputsDownDuration); n++)
        NavInputsDownDuration[n] = NavInputsDownDurationPrev[n] = -1.0f;
}